

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
duckdb_fmt::v6::internal::basic_writer<duckdb_fmt::v6::buffer_range<char>>::
padded_int_writer<duckdb_fmt::v6::internal::basic_writer<duckdb_fmt::v6::buffer_range<char>>::int_writer<int,duckdb_fmt::v6::basic_format_specs<char>>::bin_writer<3>>
::operator()(padded_int_writer<duckdb_fmt::v6::internal::basic_writer<duckdb_fmt::v6::buffer_range<char>>::int_writer<int,duckdb_fmt::v6::basic_format_specs<char>>::bin_writer<3>>
             *this,char **it)

{
  int iVar1;
  long lVar2;
  long lVar3;
  char *__s;
  size_t __n;
  bool bVar4;
  byte *pbVar5;
  uint uVar6;
  long lVar7;
  size_t __len;
  char *pcVar8;
  
  lVar2 = *(long *)(this + 0x10);
  if (lVar2 != 0) {
    lVar3 = *(long *)(this + 8);
    pcVar8 = *it;
    lVar7 = 0;
    do {
      pcVar8[lVar7] = *(char *)(lVar3 + lVar7);
      lVar7 = lVar7 + 1;
    } while (lVar2 != lVar7);
    *it = pcVar8 + lVar7;
  }
  __s = *it;
  __n = *(size_t *)(this + 0x20);
  pcVar8 = __s;
  if (__n != 0) {
    pcVar8 = __s + __n;
    switchD_005700f1::default(__s,*(int *)(this + 0x18),__n);
  }
  *it = pcVar8;
  iVar1 = *(int *)(this + 0x2c);
  pbVar5 = (byte *)(__s + __n + (long)iVar1);
  uVar6 = *(uint *)(this + 0x28);
  do {
    pbVar5 = pbVar5 + -1;
    *pbVar5 = (byte)uVar6 & 7 | 0x30;
    bVar4 = 7 < uVar6;
    uVar6 = uVar6 >> 3;
  } while (bVar4);
  *it = pcVar8 + iVar1;
  return;
}

Assistant:

void operator()(It&& it) const {
      if (prefix.size() != 0)
        it = copy_str<char_type>(prefix.begin(), prefix.end(), it);
      it = std::fill_n(it, padding, fill);
      f(it);
    }